

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adam_benchmark.cpp
# Opt level: O0

void testModernIO(char *inFile,char *outFile,vector<char,_std::allocator<char>_> *inBuffer)

{
  open_mode mode;
  mutable_buffer local_d8;
  mutable_buffer local_c8;
  ulong local_b8;
  size_t chunk;
  size_t bytesLeft;
  stream_position<long> local_a0;
  size_t local_98;
  offset_type inFileSize;
  file local_64;
  file out;
  path local_50;
  file local_28;
  file in;
  vector<char,_std::allocator<char>_> *inBuffer_local;
  char *outFile_local;
  char *inFile_local;
  
  in.fd_ = (file_descriptor_handle)inBuffer;
  inBuffer_local = (vector<char,_std::allocator<char>_> *)outFile;
  outFile_local = inFile;
  std::filesystem::__cxx11::path::path<char_const*,std::filesystem::__cxx11::path>
            (&local_50,&outFile_local,auto_format);
  io::posix::file::file(&local_28,&local_50,read_only,owner_read|owner_write);
  std::filesystem::__cxx11::path::~path(&local_50);
  std::filesystem::__cxx11::path::path<char_const*,std::filesystem::__cxx11::path>
            ((path *)&inFileSize,(char **)&inBuffer_local,auto_format);
  mode = io::operator|(write_only,create);
  io::posix::file::file(&local_64,(path *)&inFileSize,mode,owner_read|owner_write);
  std::filesystem::__cxx11::path::~path((path *)&inFileSize);
  local_a0.pos_ = (offset_type)io::seek<io::posix::file,void>(&local_28,0,end);
  local_98 = io::stream_position<long>::offset_from_start(&local_a0);
  bytesLeft = (size_t)io::seek<io::posix::file,void>(&local_28,0,start);
  chunk = local_98;
  local_b8 = std::vector<char,_std::allocator<char>_>::size
                       ((vector<char,_std::allocator<char>_> *)in.fd_);
  for (; chunk != 0; chunk = chunk - local_b8) {
    if (chunk < local_b8) {
      local_b8 = chunk;
    }
    local_c8 = io::net::buffer<char,std::allocator<char>>
                         ((vector<char,_std::allocator<char>_> *)in.fd_,local_b8);
    io::net::read<io::posix::file,io::net::mutable_buffer>(&local_28,&local_c8);
    local_d8 = io::net::buffer<char,std::allocator<char>>
                         ((vector<char,_std::allocator<char>_> *)in.fd_,local_b8);
    io::net::write<io::posix::file,io::net::mutable_buffer,void>(&local_64,&local_d8);
  }
  io::posix::file::~file(&local_64);
  io::posix::file::~file(&local_28);
  return;
}

Assistant:

void testModernIO(const char* inFile, const char* outFile, std::vector<char>& inBuffer)
{
    auto in = io::file{inFile, io::open_mode::read_only};
    auto out = io::file{outFile,
                        io::open_mode::write_only | io::open_mode::create};

    const auto inFileSize = io::seek(in, 0, io::seek_mode::end).offset_from_start();
    io::seek(in, 0, io::seek_mode::start);

    for (size_t bytesLeft = inFileSize, chunk = inBuffer.size(); bytesLeft > 0; bytesLeft -= chunk)
    {
        if (bytesLeft < chunk)
        {
            chunk = bytesLeft;
        }

        io::read(in, io::buffer(inBuffer, chunk));
        io::write(out, io::buffer(inBuffer, chunk));
    }
}